

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test::
TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test
          (TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test *this)

{
  TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test_003546e8;
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope2::lazy", expectations);

    mock("scope1").expectNoCall("lazy");
    mock("scope2").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}